

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_builtins.cpp
# Opt level: O0

spv_result_t __thiscall
spvtools::val::anon_unknown_0::BuiltInsValidator::ValidateLayerOrViewportIndexAtDefinition
          (BuiltInsValidator *this,Decoration *decoration,Instruction *inst)

{
  ValidationState_t *this_00;
  Instruction *inst_00;
  Instruction *decoration_00;
  bool bVar1;
  int iVar2;
  uint32_t id;
  spv_result_t sVar3;
  spv_const_context psVar4;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar5;
  const_reference pvVar6;
  DiagnosticStream *pDVar7;
  AssemblyGrammar *this_01;
  char *local_2b0;
  string local_2a8;
  DiagnosticStream local_288;
  uint32_t local_b0;
  value_type local_ac;
  uint32_t vkerrid;
  BuiltIn label;
  Instruction *local_a0;
  Instruction *local_98;
  function<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_90;
  undefined4 local_6c;
  undefined1 auStack_68 [4];
  spv_result_t error_1;
  Instruction *local_60;
  Instruction *local_58;
  function<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_50;
  undefined4 local_2c;
  Instruction *pIStack_28;
  spv_result_t error;
  Instruction *inst_local;
  Decoration *decoration_local;
  BuiltInsValidator *this_local;
  
  pIStack_28 = inst;
  inst_local = (Instruction *)decoration;
  decoration_local = (Decoration *)this;
  psVar4 = ValidationState_t::context(this->_);
  bVar1 = spvIsVulkanEnv(psVar4->target_env);
  if (bVar1) {
    iVar2 = Decoration::struct_member_index((Decoration *)inst_local);
    decoration_00 = inst_local;
    inst_00 = pIStack_28;
    if (iVar2 == -1) {
      local_a0 = inst_local;
      local_98 = pIStack_28;
      _vkerrid = this;
      std::function<spv_result_t(std::__cxx11::string_const&)>::
      function<spvtools::val::(anonymous_namespace)::BuiltInsValidator::ValidateLayerOrViewportIndexAtDefinition(spvtools::val::Decoration_const&,spvtools::val::Instruction_const&)::__1,void>
                ((function<spv_result_t(std::__cxx11::string_const&)> *)&local_90,
                 (anon_class_24_3_d7274e9b *)&vkerrid);
      sVar3 = ValidateOptionalArrayedI32(this,(Decoration *)decoration_00,inst_00,&local_90);
      std::
      function<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
      ::~function(&local_90);
      if (sVar3 != SPV_SUCCESS) {
        return sVar3;
      }
      local_6c = 0;
    }
    else {
      local_60 = inst_local;
      local_58 = pIStack_28;
      _auStack_68 = this;
      std::function<spv_result_t(std::__cxx11::string_const&)>::
      function<spvtools::val::(anonymous_namespace)::BuiltInsValidator::ValidateLayerOrViewportIndexAtDefinition(spvtools::val::Decoration_const&,spvtools::val::Instruction_const&)::__0,void>
                ((function<spv_result_t(std::__cxx11::string_const&)> *)&local_50,
                 (anon_class_24_3_d7274e9b *)auStack_68);
      sVar3 = ValidateI32(this,(Decoration *)decoration_00,inst_00,&local_50);
      std::
      function<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
      ::~function(&local_50);
      if (sVar3 != SPV_SUCCESS) {
        return sVar3;
      }
      local_2c = 0;
    }
    bVar1 = isMeshInterfaceVar(this,pIStack_28);
    if ((bVar1) &&
       (bVar1 = ValidationState_t::HasCapability(this->_,CapabilityMeshShadingEXT), bVar1)) {
      this_00 = this->_;
      id = val::Instruction::id(pIStack_28);
      bVar1 = ValidationState_t::HasDecoration(this_00,id,DecorationPerPrimitiveEXT);
      if (!bVar1) {
        pvVar5 = Decoration::params((Decoration *)inst_local);
        pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](pvVar5,0);
        local_ac = *pvVar6;
        local_b0 = 0x1b94;
        if (local_ac == 9) {
          local_b0 = 0x1b7f;
        }
        ValidationState_t::diag(&local_288,this->_,SPV_ERROR_INVALID_DATA,pIStack_28);
        ValidationState_t::VkErrorID_abi_cxx11_(&local_2a8,this->_,local_b0,(char *)0x0);
        pDVar7 = DiagnosticStream::operator<<(&local_288,&local_2a8);
        pDVar7 = DiagnosticStream::operator<<
                           (pDVar7,(char (*) [66])
                                   "According to the Vulkan spec the variable decorated with Builtin "
                           );
        this_01 = ValidationState_t::grammar(this->_);
        pvVar5 = Decoration::params((Decoration *)inst_local);
        pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](pvVar5,0);
        local_2b0 = AssemblyGrammar::lookupOperandName(this_01,SPV_OPERAND_TYPE_BUILT_IN,*pvVar6);
        pDVar7 = DiagnosticStream::operator<<(pDVar7,&local_2b0);
        pDVar7 = DiagnosticStream::operator<<(pDVar7,(char (*) [97])0xf2dfee);
        this_local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar7);
        std::__cxx11::string::~string((string *)&local_2a8);
        DiagnosticStream::~DiagnosticStream(&local_288);
        return this_local._4_4_;
      }
    }
  }
  sVar3 = ValidateLayerOrViewportIndexAtReference
                    (this,(Decoration *)inst_local,pIStack_28,pIStack_28,pIStack_28);
  return sVar3;
}

Assistant:

spv_result_t BuiltInsValidator::ValidateLayerOrViewportIndexAtDefinition(
    const Decoration& decoration, const Instruction& inst) {
  if (spvIsVulkanEnv(_.context()->target_env)) {
    // This can be a per-primitive variable for mesh shader stage.
    // In such cases variable will have an array of 32-bit integers.
    if (decoration.struct_member_index() != Decoration::kInvalidMember) {
      // This must be a 32-bit int scalar.
      if (spv_result_t error = ValidateI32(
              decoration, inst,
              [this, &decoration,
               &inst](const std::string& message) -> spv_result_t {
                uint32_t vuid =
                    (decoration.builtin() == spv::BuiltIn::Layer) ? 4276 : 4408;
                return _.diag(SPV_ERROR_INVALID_DATA, &inst)
                       << _.VkErrorID(vuid)
                       << "According to the Vulkan spec BuiltIn "
                       << _.grammar().lookupOperandName(
                              SPV_OPERAND_TYPE_BUILT_IN,
                              (uint32_t)decoration.builtin())
                       << "variable needs to be a 32-bit int scalar. "
                       << message;
              })) {
        return error;
      }
    } else {
      if (spv_result_t error = ValidateOptionalArrayedI32(
              decoration, inst,
              [this, &decoration,
               &inst](const std::string& message) -> spv_result_t {
                uint32_t vuid =
                    (decoration.builtin() == spv::BuiltIn::Layer) ? 4276 : 4408;
                return _.diag(SPV_ERROR_INVALID_DATA, &inst)
                       << _.VkErrorID(vuid)
                       << "According to the Vulkan spec BuiltIn "
                       << _.grammar().lookupOperandName(
                              SPV_OPERAND_TYPE_BUILT_IN,
                              (uint32_t)decoration.builtin())
                       << "variable needs to be a 32-bit int scalar. "
                       << message;
              })) {
        return error;
      }
    }

    if (isMeshInterfaceVar(inst) &&
        _.HasCapability(spv::Capability::MeshShadingEXT) &&
        !_.HasDecoration(inst.id(), spv::Decoration::PerPrimitiveEXT)) {
      const spv::BuiltIn label = spv::BuiltIn(decoration.params()[0]);
      uint32_t vkerrid = (label == spv::BuiltIn::Layer) ? 7039 : 7060;
      return _.diag(SPV_ERROR_INVALID_DATA, &inst)
             << _.VkErrorID(vkerrid)
             << "According to the Vulkan spec the variable decorated with "
                "Builtin "
             << _.grammar().lookupOperandName(SPV_OPERAND_TYPE_BUILT_IN,
                                              decoration.params()[0])
             << " within the MeshEXT Execution Model must also be decorated "
                "with the PerPrimitiveEXT decoration. ";
    }
  }

  // Seed at reference checks with this built-in.
  return ValidateLayerOrViewportIndexAtReference(decoration, inst, inst, inst);
}